

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

void __thiscall capnp::QueuedClient::~QueuedClient(QueuedClient *this)

{
  kj::Own<kj::_::ForkHub<kj::Own<capnp::ClientHook,_std::nullptr_t>_>,_std::nullptr_t>::dispose
            (&(this->promiseForClientResolution).hub);
  kj::Own<kj::_::ForkHub<kj::Own<capnp::ClientHook,_std::nullptr_t>_>,_std::nullptr_t>::dispose
            (&(this->promiseForCallForwarding).hub);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&this->selfResolutionOp);
  kj::Own<kj::_::ForkHub<kj::Own<capnp::ClientHook,_std::nullptr_t>_>,_std::nullptr_t>::dispose
            (&(this->promise).hub);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&(this->redirect).ptr);
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

class QueuedClient final: public ClientHook, public kj::Refcounted {
  // A ClientHook which simply queues calls while waiting for a ClientHook to which to forward
  // them.

public:
  QueuedClient(kj::Promise<kj::Own<ClientHook>>&& promiseParam)
      : promise(promiseParam.fork()),
        selfResolutionOp(promise.addBranch().then([this](kj::Own<ClientHook>&& inner) {
          redirect = kj::mv(inner);
        }, [this](kj::Exception&& exception) {
          redirect = newBrokenCap(kj::mv(exception));
        }).eagerlyEvaluate(nullptr)),
        promiseForCallForwarding(promise.addBranch().fork()),
        promiseForClientResolution(promise.addBranch().fork()) {}

  Request<AnyPointer, AnyPointer> newCall(
      uint64_t interfaceId, uint16_t methodId, kj::Maybe<MessageSize> sizeHint,
      CallHints hints) override {
    auto hook = kj::heap<LocalRequest>(
        interfaceId, methodId, sizeHint, hints, kj::addRef(*this));
    auto root = hook->message->getRoot<AnyPointer>();
    return Request<AnyPointer, AnyPointer>(root, kj::mv(hook));
  }

  VoidPromiseAndPipeline call(uint64_t interfaceId, uint16_t methodId,
                              kj::Own<CallContextHook>&& context, CallHints hints) override {
    if (hints.noPromisePipelining) {
      // Optimize for no pipelining.
      auto promise = promiseForCallForwarding.addBranch()
          .then([=,context=kj::mv(context)](kj::Own<ClientHook>&& client) mutable {
        return client->call(interfaceId, methodId, kj::mv(context), hints).promise;
      });
      return VoidPromiseAndPipeline { kj::mv(promise), getDisabledPipeline() };
    } else if (hints.onlyPromisePipeline) {
      auto pipelinePromise = promiseForCallForwarding.addBranch()
          .then([=,context=kj::mv(context)](kj::Own<ClientHook>&& client) mutable {
        return client->call(interfaceId, methodId, kj::mv(context), hints).pipeline;
      });
      return VoidPromiseAndPipeline {
        kj::NEVER_DONE,
        kj::refcounted<QueuedPipeline>(kj::mv(pipelinePromise))
      };
    } else {
      auto split = promiseForCallForwarding.addBranch()
          .then([=,context=kj::mv(context)](kj::Own<ClientHook>&& client) mutable {
        auto vpap = client->call(interfaceId, methodId, kj::mv(context), hints);
        return kj::tuple(kj::mv(vpap.promise), kj::mv(vpap.pipeline));
      }).split();

      kj::Promise<void> completionPromise = kj::mv(kj::get<0>(split));
      kj::Promise<kj::Own<PipelineHook>> pipelinePromise = kj::mv(kj::get<1>(split));

      auto pipeline = kj::refcounted<QueuedPipeline>(kj::mv(pipelinePromise));

      // OK, now we can actually return our thing.
      return VoidPromiseAndPipeline { kj::mv(completionPromise), kj::mv(pipeline) };
    }
  }

  kj::Maybe<ClientHook&> getResolved() override {
    KJ_IF_SOME(inner, redirect) {
      return *inner;
    } else {
      return kj::none;
    }
  }

  kj::Maybe<kj::Promise<kj::Own<ClientHook>>> whenMoreResolved() override {
    return promiseForClientResolution.addBranch();
  }